

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool __thiscall
matchit::impl::Id<mathiu::impl::Set>::matchValue<mathiu::impl::Set_const&>
          (Id<mathiu::impl::Set> *this,Set *v)

{
  bool bVar1;
  Set *lhs;
  IdBlockBase<mathiu::impl::Set> *this_00;
  ValueVariant<mathiu::impl::Set> *pVVar2;
  Set *v_local;
  Id<mathiu::impl::Set> *this_local;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    lhs = internalValue(this);
    this_local._7_1_ = IdTraits<mathiu::impl::Set>::equal(lhs,v);
  }
  else {
    this_00 = &block(this)->super_IdBlockBase<mathiu::impl::Set>;
    pVVar2 = IdBlockBase<mathiu::impl::Set>::variant(this_00);
    IdUtil<mathiu::impl::Set>::bindValue<mathiu::impl::Set_const&>(pVVar2,v);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }